

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compression_utils.cpp
# Opt level: O1

void convertIntArray2ByteArray_fast_1b_to_result_sz
               (uchar *intArray,size_t intArrayLength,uchar **compressed_pos)

{
  uchar *puVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uchar uVar7;
  uint uVar8;
  uint uVar9;
  
  lVar2 = (ulong)((intArrayLength & 7) != 0) + (intArrayLength >> 3);
  if (lVar2 != 0) {
    uVar5 = 0;
    lVar6 = 0;
    do {
      uVar9 = 0;
      uVar7 = '\0';
      if (uVar5 < intArrayLength) {
        bVar3 = 7;
        uVar4 = 0;
        do {
          uVar8 = 1 << (bVar3 & 0x1f);
          if (intArray[uVar5] != '\x01') {
            uVar8 = 0;
          }
          uVar9 = uVar8 | uVar9;
          uVar7 = (uchar)uVar9;
          uVar5 = uVar5 + 1;
          if (6 < uVar4) break;
          uVar4 = uVar4 + 1;
          bVar3 = bVar3 - 1;
        } while (uVar5 < intArrayLength);
      }
      puVar1 = *compressed_pos;
      *compressed_pos = puVar1 + 1;
      *puVar1 = uVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void 
convertIntArray2ByteArray_fast_1b_to_result_sz(const unsigned char* intArray, size_t intArrayLength, unsigned char *& compressed_pos){
	size_t byteLength = 0;
	size_t i, j; 
	if(intArrayLength%8==0)
		byteLength = intArrayLength/8;
	else
		byteLength = intArrayLength/8+1;
		
	size_t n = 0;
	int tmp, type;
	for(i = 0;i<byteLength;i++){
		tmp = 0;
		for(j = 0;j<8&&n<intArrayLength;j++){
			type = intArray[n];
			if(type == 1)
				tmp = (tmp | (1 << (7-j)));
			n++;
		}
    	*(compressed_pos++) = (unsigned char)tmp;
	}
}